

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeglobpattern.cpp
# Opt level: O3

void __thiscall QMimeAllGlobPatterns::addGlob(QMimeAllGlobPatterns *this,QMimeGlobPattern *glob)

{
  Entry *pEVar1;
  QMimeGlobPattern *pQVar2;
  bool bVar3;
  uint uVar4;
  qsizetype qVar5;
  const_iterator cVar6;
  CaseSensitivity cs;
  CaseSensitivity in_R9D;
  QtPrivate *pQVar8;
  QMimeGlobPattern *pQVar9;
  char16_t *pcVar10;
  long in_FS_OFFSET;
  QStringView haystack;
  QStringView haystack_00;
  QStringView str;
  QStringView haystack0;
  QStringView haystack0_00;
  QStringView needle0;
  QStringView needle0_00;
  QString local_68;
  undefined1 local_50 [24];
  char16_t *pcStack_38;
  long local_30;
  storage_type_conflict *psVar7;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (glob->m_weight == 0x32) {
    pcVar10 = (glob->m_pattern).d.ptr;
    pQVar8 = (QtPrivate *)(glob->m_pattern).d.size;
    haystack.m_data = (storage_type_conflict *)0xffffffffffffffff;
    haystack.m_size = (qsizetype)pcVar10;
    qVar5 = QtPrivate::lastIndexOf(pQVar8,haystack,0x2a,L'\x01',in_R9D);
    if (qVar5 == 0) {
      haystack_00.m_data = (storage_type_conflict *)0xffffffffffffffff;
      haystack_00.m_size = (qsizetype)pcVar10;
      qVar5 = QtPrivate::lastIndexOf(pQVar8,haystack_00,0x2e,L'\x01',in_R9D);
      if (qVar5 == 1) {
        local_50._0_2_ = L'?';
        haystack0.m_data = pcVar10;
        haystack0.m_size = (qsizetype)pQVar8;
        needle0.m_data = (storage_type_conflict *)local_50;
        needle0.m_size = 1;
        qVar5 = QtPrivate::findString(haystack0,0,needle0,CaseSensitive);
        if (qVar5 == -1) {
          psVar7 = (storage_type_conflict *)local_50;
          local_50._0_2_ = 0x5b;
          haystack0_00.m_data = pcVar10;
          haystack0_00.m_size = (qsizetype)pQVar8;
          needle0_00.m_data = psVar7;
          needle0_00.m_size = 1;
          qVar5 = QtPrivate::findString(haystack0_00,0,needle0_00,CaseSensitive);
          cs = (CaseSensitivity)psVar7;
          if ((qVar5 == -1) && (glob->m_caseSensitivity != CaseSensitive)) {
            local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_68.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            QString::mid((QString *)local_50,&glob->m_pattern,2,-1);
            QString::toLower_helper(&local_68,(QString *)local_50);
            if ((Data<QHashPrivate::Node<QString,_QList<QString>_>_> *)local_50._0_8_ !=
                (Data<QHashPrivate::Node<QString,_QList<QString>_>_> *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_50._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_50._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_50._0_8_)->_q_value).super___atomic_base<int>._M_i == 0
                 ) {
                QArrayData::deallocate((QArrayData *)local_50._0_8_,2,0x10);
              }
            }
            QHash<QString,QList<QString>>::tryEmplace_impl<QString_const&>
                      ((TryEmplaceResult *)local_50,(QHash<QString,QList<QString>> *)this,&local_68)
            ;
            pEVar1 = (*(Span **)(local_50._0_8_ + 0x20))[(ulong)local_50._8_8_ >> 7].entries;
            uVar4 = (uint)(*(Span **)(local_50._0_8_ + 0x20))[(ulong)local_50._8_8_ >> 7].offsets
                          [(uint)local_50._8_8_ & 0x7f];
            pQVar8 = (QtPrivate *)((pEVar1->storage).data + (ulong)(uVar4 * 0x30) + 0x18);
            str.m_data = (storage_type_conflict *)0x1;
            str.m_size = (qsizetype)(glob->m_mimeType).d.ptr;
            bVar3 = QtPrivate::QStringList_contains
                              (pQVar8,(QStringList *)(glob->m_mimeType).d.size,str,cs);
            if (!bVar3) {
              QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                        ((QMovableArrayOps<QString> *)pQVar8,
                         *(qsizetype *)((pEVar1->storage).data + (ulong)(uVar4 * 0x30) + 0x28),
                         &glob->m_mimeType);
              QList<QString>::end((QList<QString> *)pQVar8);
            }
            if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
              }
            }
            goto LAB_004a51f6;
          }
        }
      }
    }
LAB_004a5190:
    local_50._8_8_ = (glob->m_mimeType).d.ptr;
    local_50._0_8_ = (glob->m_mimeType).d.size;
    pQVar2 = (this->m_lowWeightGlobs).super_QList<QMimeGlobPattern>.d.ptr;
    pQVar9 = pQVar2 + (this->m_lowWeightGlobs).super_QList<QMimeGlobPattern>.d.size;
    local_50._16_8_ = pQVar8;
    pcStack_38 = pcVar10;
    cVar6 = std::
            __find_if<QList<QMimeGlobPattern>::const_iterator,__gnu_cxx::__ops::_Iter_pred<QMimeGlobPatternList::hasPattern(QStringView,QStringView)const::_lambda(QMimeGlobPattern_const&)_1_>>
                      (pQVar2,pQVar9);
    if (cVar6.i == pQVar9) {
      QtPrivate::QMovableArrayOps<QMimeGlobPattern>::emplace<QMimeGlobPattern_const&>
                ((QMovableArrayOps<QMimeGlobPattern> *)&this->m_lowWeightGlobs,
                 (this->m_lowWeightGlobs).super_QList<QMimeGlobPattern>.d.size,glob);
      QList<QMimeGlobPattern>::end(&(this->m_lowWeightGlobs).super_QList<QMimeGlobPattern>);
    }
  }
  else {
    if ((uint)glob->m_weight < 0x33) {
      pcVar10 = (glob->m_pattern).d.ptr;
      pQVar8 = (QtPrivate *)(glob->m_pattern).d.size;
      goto LAB_004a5190;
    }
    local_50._8_8_ = (glob->m_mimeType).d.ptr;
    local_50._0_8_ = (glob->m_mimeType).d.size;
    pcStack_38 = (glob->m_pattern).d.ptr;
    local_50._16_8_ = (glob->m_pattern).d.size;
    pQVar2 = (this->m_highWeightGlobs).super_QList<QMimeGlobPattern>.d.ptr;
    pQVar9 = pQVar2 + (this->m_highWeightGlobs).super_QList<QMimeGlobPattern>.d.size;
    cVar6 = std::
            __find_if<QList<QMimeGlobPattern>::const_iterator,__gnu_cxx::__ops::_Iter_pred<QMimeGlobPatternList::hasPattern(QStringView,QStringView)const::_lambda(QMimeGlobPattern_const&)_1_>>
                      (pQVar2,pQVar9);
    if (cVar6.i == pQVar9) {
      QtPrivate::QMovableArrayOps<QMimeGlobPattern>::emplace<QMimeGlobPattern_const&>
                ((QMovableArrayOps<QMimeGlobPattern> *)&this->m_highWeightGlobs,
                 (this->m_highWeightGlobs).super_QList<QMimeGlobPattern>.d.size,glob);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        QList<QMimeGlobPattern>::end(&(this->m_highWeightGlobs).super_QList<QMimeGlobPattern>);
        return;
      }
      goto LAB_004a527f;
    }
  }
LAB_004a51f6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_004a527f:
  __stack_chk_fail();
}

Assistant:

void QMimeAllGlobPatterns::addGlob(const QMimeGlobPattern &glob)
{
    const QString &pattern = glob.pattern();
    Q_ASSERT(!pattern.isEmpty());

    // Store each patterns into either m_fastPatternDict (*.txt, *.html etc. with default weight 50)
    // or for the rest, like core.*, *.tar.bz2, *~, into highWeightPatternOffset (>50)
    // or lowWeightPatternOffset (<=50)

    if (glob.weight() == 50 && isFastPattern(pattern) && !glob.isCaseSensitive()) {
        // The bulk of the patterns is *.foo with weight 50 --> those go into the fast patterns hash.
        const QString extension = pattern.mid(2).toLower();
        QStringList &patterns = m_fastPatterns[extension]; // find or create
        if (!patterns.contains(glob.mimeType()))
            patterns.append(glob.mimeType());
    } else {
        if (glob.weight() > 50) {
            if (!m_highWeightGlobs.hasPattern(glob.mimeType(), glob.pattern()))
                m_highWeightGlobs.append(glob);
        } else {
            if (!m_lowWeightGlobs.hasPattern(glob.mimeType(), glob.pattern()))
                m_lowWeightGlobs.append(glob);
        }
    }
}